

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall
Catch::Detail::CaseInsensitiveLess::operator()
          (CaseInsensitiveLess *this,StringRef lhs,StringRef rhs)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  
  sVar6 = rhs.m_size;
  pcVar5 = rhs.m_start;
  sVar8 = lhs.m_size;
  if ((long)sVar6 < (long)lhs.m_size) {
    sVar8 = sVar6;
  }
  pcVar4 = pcVar5;
  if (sVar8 != 0) {
    pcVar4 = pcVar5 + sVar8;
    sVar7 = 0;
    do {
      bVar1 = pcVar5[sVar7];
      iVar2 = tolower((uint)(byte)lhs.m_start[sVar7]);
      iVar3 = tolower((uint)bVar1);
      if ((char)iVar3 != (char)iVar2) {
        return (char)iVar2 < (char)iVar3;
      }
      sVar7 = sVar7 + 1;
    } while (sVar8 != sVar7);
  }
  return pcVar4 != pcVar5 + sVar6;
}

Assistant:

bool CaseInsensitiveLess::operator()( StringRef lhs,
                                              StringRef rhs ) const {
            return std::lexicographical_compare(
                lhs.begin(), lhs.end(),
                rhs.begin(), rhs.end(),
                []( char l, char r ) { return toLower( l ) < toLower( r ); } );
        }